

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_if_statement(Parser *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Symbol_Table *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  int local_14;
  Parser *pPStack_10;
  int label_count;
  Parser *this_local;
  
  pPStack_10 = this;
  poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t<if_statement>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_00 = &this->symbol_table;
  local_14 = Symbol_Table::get_label_count(this_00);
  VM_Writer::write_if(this->vm_writer,local_14);
  Symbol_Table::increment_label_count(this_00);
  Symbol_Table::increment_label_count(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"(",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"if statement",&local_71);
  check_expected_x_after_y(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_b8,"\t\t\t\t<symbol>",&this->cur_token);
  std::operator+(&local_98,&local_b8,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_98);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  query_tokenizer(this);
  parse_expression(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,")",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"expression",&local_101);
  check_expected_x_after_y(this,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_148,"\t\t\t\t<symbol>",&this->cur_token);
  std::operator+(&local_128,&local_148,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_128);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  query_tokenizer(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"{",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,")",&local_191);
  check_expected_x_after_y(this,&local_168,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_1d8,"\t\t\t\t<symbol>",&this->cur_token);
  std::operator+(&local_1b8,&local_1d8,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_1b8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  query_tokenizer(this);
  parse_statements(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"}",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"statements",&local_221);
  check_expected_x_after_y(this,&local_1f8,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_268,"\t\t\t\t<symbol>",&this->cur_token);
  std::operator+(&local_248,&local_268,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_248);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  query_tokenizer(this);
  bVar1 = std::operator==(&this->cur_token,"else");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t<else_statement>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    VM_Writer::write_label(this->vm_writer,local_14);
    local_14 = local_14 + 1;
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"{",&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"else statement",&local_2b1);
    check_expected_x_after_y(this,&local_288,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    poVar3 = (ostream *)this->out_file;
    std::operator+(&local_2f8,"\t\t\t\t<symbol>",&this->cur_token);
    std::operator+(&local_2d8,&local_2f8,"</symbol>");
    poVar3 = std::operator<<(poVar3,(string *)&local_2d8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    query_tokenizer(this);
    iVar2 = Tokenizer::get_keyword_val(this->tokenizer,&this->cur_token);
    if ((iVar2 < 9) &&
       (iVar2 = Tokenizer::get_keyword_val(this->tokenizer,&this->cur_token), 0xe < iVar2)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Expected a statement after {");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    parse_statements(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"}",&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"statements",&local_341)
    ;
    check_expected_x_after_y(this,&local_318,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator(&local_341);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    poVar3 = (ostream *)this->out_file;
    std::operator+(&local_388,"\t\t\t\t<symbol>",&this->cur_token);
    std::operator+(&local_368,&local_388,"</symbol>");
    poVar3 = std::operator<<(poVar3,(string *)&local_368);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    VM_Writer::write_goto(this->vm_writer,local_14);
    Symbol_Table::increment_label_count(&this->symbol_table);
    query_tokenizer(this);
  }
  VM_Writer::write_label(this->vm_writer,local_14);
  poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t</if_statement>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Parser::parse_if_statement() {
    out_file << "\t\t\t<if_statement>" << std::endl;

    int label_count = symbol_table.get_label_count();
    vm_writer.write_if(label_count);
    // reserve two labels for each potential if-else pair
    symbol_table.increment_label_count();
    symbol_table.increment_label_count();


    check_expected_x_after_y("(", "if statement");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    parse_expression();

    check_expected_x_after_y(")", "expression");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    check_expected_x_after_y("{", ")");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    parse_statements();

    check_expected_x_after_y("}", "statements");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    if (cur_token == "else") {
        out_file << "\t\t\t<else_statement>" << std::endl;
        vm_writer.write_label(label_count);
        label_count++;
        query_tokenizer();

        check_expected_x_after_y("{", "else statement");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();

        if (tokenizer.get_keyword_val(cur_token) < LET && tokenizer.get_keyword_val(cur_token) > DO) {
            std::cerr << "Expected a statement after {" << std::endl;
            exit(0);
        }
        parse_statements();

        check_expected_x_after_y("}", "statements");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        vm_writer.write_goto(label_count);

        // increment for the next (potential) if statement
        symbol_table.increment_label_count();
        query_tokenizer();
    }

    vm_writer.write_label(label_count);
    out_file << "\t\t\t</if_statement>" << std::endl;
}